

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O1

MyGame_Example_Monster_ref_t
MyGame_Example_Monster_clone(flatbuffers_builder_t *B,MyGame_Example_Monster_table_t t)

{
  ushort uVar1;
  flatcc_refmap_ref_t fVar2;
  int iVar3;
  MyGame_Example_Monster_ref_t ref;
  void *pvVar4;
  
  if (B->refmap == (flatcc_refmap_t *)0x0) {
    fVar2 = 0;
  }
  else {
    fVar2 = flatcc_refmap_find(B->refmap,t);
  }
  if (fVar2 != 0) {
    return fVar2;
  }
  iVar3 = flatcc_builder_start_table(B,0x24);
  if (iVar3 == 0) {
    if (t == (MyGame_Example_Monster_table_t)0x0) {
      __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/monster_test/generated/monster_test_reader.h"
                    ,0x43d,
                    "MyGame_Example_Vec3_struct_t MyGame_Example_Monster_pos_get(MyGame_Example_Monster_table_t)"
                   );
    }
    if (*(ushort *)(t + -(long)*(int *)t) < 6) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(t + (4 - (long)*(int *)t));
    }
    if ((uVar1 != 0) &&
       (pvVar4 = flatcc_builder_table_add_copy(B,0,t + uVar1,0x20,0x10), pvVar4 == (void *)0x0)) {
      return 0;
    }
    if (*(ushort *)(t + -(long)*(int *)t) < 0x2a) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)(t + (0x28 - (long)*(int *)t));
    }
    if ((uVar1 == 0) ||
       (pvVar4 = flatcc_builder_table_add_copy(B,0x12,t + uVar1,8,8), pvVar4 != (void *)0x0)) {
      if (*(ushort *)(t + -(long)*(int *)t) < 0x2c) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(ushort *)(t + (0x2a - (long)*(int *)t));
      }
      if ((uVar1 == 0) ||
         (pvVar4 = flatcc_builder_table_add_copy(B,0x13,t + uVar1,8,8), pvVar4 != (void *)0x0)) {
        if (*(ushort *)(t + -(long)*(int *)t) < 0x32) {
          uVar1 = 0;
        }
        else {
          uVar1 = *(ushort *)(t + (0x30 - (long)*(int *)t));
        }
        if ((uVar1 == 0) ||
           (pvVar4 = flatcc_builder_table_add_copy(B,0x16,t + uVar1,8,8), pvVar4 != (void *)0x0)) {
          if (*(ushort *)(t + -(long)*(int *)t) < 0x34) {
            uVar1 = 0;
          }
          else {
            uVar1 = *(ushort *)(t + (0x32 - (long)*(int *)t));
          }
          if ((uVar1 == 0) ||
             (pvVar4 = flatcc_builder_table_add_copy(B,0x17,t + uVar1,8,8), pvVar4 != (void *)0x0))
          {
            iVar3 = MyGame_Example_Monster_name_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_inventory_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testarrayoftables_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testarrayofstring_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testarrayofstring2_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testarrayofbools_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testarrayofsortedstruct_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_enemy_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_test_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_test4_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_test5_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testnestedflatbuffer_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testempty_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testhashs32_fnv1_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testhashu32_fnv1_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testhashs32_fnv1a_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testhashu32_fnv1a_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testf_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testf2_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testf3_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_flex_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_vector_of_longs_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_vector_of_doubles_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_parent_namespace_test_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testbase64_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_hp_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_mana_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_color_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            iVar3 = MyGame_Example_Monster_testbool_pick(B,t);
            if (iVar3 != 0) {
              return 0;
            }
            ref = MyGame_Example_Monster_end(B);
            if (B->refmap == (flatcc_refmap_t *)0x0) {
              return ref;
            }
            fVar2 = flatcc_refmap_insert(B->refmap,t,ref);
            return fVar2;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static MyGame_Example_Monster_ref_t MyGame_Example_Monster_clone(flatbuffers_builder_t *B, MyGame_Example_Monster_table_t t)
{
    __flatbuffers_memoize_begin(B, t);
    if (MyGame_Example_Monster_start(B)
        || MyGame_Example_Monster_pos_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_name_pick(B, t)
        || MyGame_Example_Monster_inventory_pick(B, t)
        || MyGame_Example_Monster_testarrayoftables_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring2_pick(B, t)
        || MyGame_Example_Monster_testarrayofbools_pick(B, t)
        || MyGame_Example_Monster_testarrayofsortedstruct_pick(B, t)
        || MyGame_Example_Monster_enemy_pick(B, t)
        || MyGame_Example_Monster_test_pick(B, t)
        || MyGame_Example_Monster_test4_pick(B, t)
        || MyGame_Example_Monster_test5_pick(B, t)
        || MyGame_Example_Monster_testnestedflatbuffer_pick(B, t)
        || MyGame_Example_Monster_testempty_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testf_pick(B, t)
        || MyGame_Example_Monster_testf2_pick(B, t)
        || MyGame_Example_Monster_testf3_pick(B, t)
        || MyGame_Example_Monster_flex_pick(B, t)
        || MyGame_Example_Monster_vector_of_longs_pick(B, t)
        || MyGame_Example_Monster_vector_of_doubles_pick(B, t)
        || MyGame_Example_Monster_parent_namespace_test_pick(B, t)
        || MyGame_Example_Monster_testbase64_pick(B, t)
        || MyGame_Example_Monster_hp_pick(B, t)
        || MyGame_Example_Monster_mana_pick(B, t)
        || MyGame_Example_Monster_color_pick(B, t)
        || MyGame_Example_Monster_testbool_pick(B, t)) {
        return 0;
    }
    __flatbuffers_memoize_end(B, t, MyGame_Example_Monster_end(B));
}